

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementShellBST::GetDensity(ChElementShellBST *this)

{
  GetDensity((ChElementShellBST *)(this[-1].e.m_data + 2));
  return;
}

Assistant:

double ChElementShellBST::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
		double rho = m_layers[kl].GetMaterial()->GetDensity();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / tot_thickness;
}